

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  _Bool _Var1;
  int iVar2;
  undefined4 *in_RCX;
  byteReader_t in_RDX;
  MCInst *in_RSI;
  long in_RDI;
  short *in_R8;
  InternalInstruction *in_R9;
  byte bVar3;
  uchar b4;
  uchar b3;
  uchar b2_1;
  uchar b1_1;
  uchar b2;
  uchar b1;
  _Bool result;
  int ret;
  reader_info info;
  InternalInstruction insn;
  cs_struct *handle;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4c;
  UI_STRING in_stack_fffffffffffffe4d;
  UI_STRING UVar4;
  UI_STRING in_stack_fffffffffffffe4e;
  UI_STRING UVar5;
  UI_STRING in_stack_fffffffffffffe4f;
  UI_STRING UVar6;
  UI_STRING in_stack_fffffffffffffe50;
  UI_STRING UVar7;
  UI_STRING in_stack_fffffffffffffe51;
  UI_STRING in_stack_fffffffffffffe52;
  undefined1 in_stack_fffffffffffffe53;
  undefined4 in_stack_fffffffffffffe54;
  MCInst *mcInst;
  InternalInstruction *insn_00;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  short local_e0;
  short local_b8;
  undefined1 local_9c;
  long local_40;
  InternalInstruction *local_38;
  short *local_30;
  undefined4 *local_28;
  byteReader_t local_20;
  MCInst *local_18;
  
  local_40 = in_RDI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&local_190,0,0x150);
  mcInst = local_18;
  insn_00 = local_38;
  if (*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) != 0) {
    memset(*(void **)(*(long *)(local_28 + 0xc4) + 0xf0),0,0x228);
    mcInst = local_18;
  }
  if ((*(uint *)(local_40 + 4) & 2) == 0) {
    if ((*(uint *)(local_40 + 4) & 4) == 0) {
      iVar2 = decodeInstruction(insn_00,local_20,mcInst,
                                CONCAT44(in_stack_fffffffffffffe54,
                                         CONCAT13(in_stack_fffffffffffffe53,
                                                  CONCAT12(in_stack_fffffffffffffe52,
                                                           CONCAT11(in_stack_fffffffffffffe51,
                                                                    in_stack_fffffffffffffe50)))),
                                CONCAT13(in_stack_fffffffffffffe4f,
                                         CONCAT12(in_stack_fffffffffffffe4e,
                                                  CONCAT11(in_stack_fffffffffffffe4d,
                                                           in_stack_fffffffffffffe4c))));
    }
    else {
      iVar2 = decodeInstruction(insn_00,local_20,mcInst,
                                CONCAT44(in_stack_fffffffffffffe54,
                                         CONCAT13(in_stack_fffffffffffffe53,
                                                  CONCAT12(in_stack_fffffffffffffe52,
                                                           CONCAT11(in_stack_fffffffffffffe51,
                                                                    in_stack_fffffffffffffe50)))),
                                CONCAT13(in_stack_fffffffffffffe4f,
                                         CONCAT12(in_stack_fffffffffffffe4e,
                                                  CONCAT11(in_stack_fffffffffffffe4d,
                                                           in_stack_fffffffffffffe4c))));
    }
  }
  else {
    iVar2 = decodeInstruction(insn_00,local_20,mcInst,
                              CONCAT44(in_stack_fffffffffffffe54,
                                       CONCAT13(in_stack_fffffffffffffe53,
                                                CONCAT12(in_stack_fffffffffffffe52,
                                                         CONCAT11(in_stack_fffffffffffffe51,
                                                                  in_stack_fffffffffffffe50)))),
                              CONCAT13(in_stack_fffffffffffffe4f,
                                       CONCAT12(in_stack_fffffffffffffe4e,
                                                CONCAT11(in_stack_fffffffffffffe4d,
                                                         in_stack_fffffffffffffe4c))));
  }
  if (iVar2 == 0) {
    *local_30 = local_b8;
    _Var1 = translateInstruction
                      (mcInst,(InternalInstruction *)
                              (ulong)CONCAT13(in_stack_fffffffffffffe53,
                                              CONCAT12(in_stack_fffffffffffffe52,
                                                       CONCAT11(in_stack_fffffffffffffe51,
                                                                in_stack_fffffffffffffe50))));
    bVar3 = ((_Var1 ^ 0xffU) & 1) != 0;
    if ((bool)bVar3) {
      if ((*(uint *)(local_40 + 4) & 8) != 0) {
        if ((local_28[2] == 0x4dd) || (local_28[2] == 0x4de)) {
          return false;
        }
        if ((local_28[2] == 0x4c3) || (local_28[2] == 0x4c4)) {
          return false;
        }
      }
      *(undefined1 *)((long)local_28 + 0x32d) = local_9c;
      if (*(int *)(local_40 + 0x60) == 0) {
        *(undefined1 *)((long)local_28 + 0x329) = local_18f;
        *(undefined1 *)((long)local_28 + 0x32a) = local_18e;
        *(undefined1 *)((long)local_28 + 0x32b) = local_18d;
        *(undefined1 *)(local_28 + 0xcb) = local_18c;
      }
      else {
        update_pub_insn((cs_insn *)
                        CONCAT44(iVar2,CONCAT13(bVar3,CONCAT12(in_stack_fffffffffffffe52,
                                                               CONCAT11(in_stack_fffffffffffffe51,
                                                                        in_stack_fffffffffffffe50)))
                                ),
                        (InternalInstruction *)
                        CONCAT17(in_stack_fffffffffffffe4f,
                                 CONCAT16(in_stack_fffffffffffffe4e,
                                          CONCAT15(in_stack_fffffffffffffe4d,
                                                   CONCAT14(in_stack_fffffffffffffe4c,
                                                            in_stack_fffffffffffffe48)))),
                        (uint8_t *)0x32c3b9);
      }
    }
    return (_Bool)(bVar3 & 1);
  }
  *local_30 = local_e0 - (short)local_38;
  if (*local_30 == 2) {
    UVar5 = (UI_STRING)0x0;
    UVar4 = (UI_STRING)0x0;
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe52);
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe51);
    if ((UVar5 == (UI_STRING)0xf) && (UVar4 == (UI_STRING)0xff)) {
      local_28[2] = 0x2295;
      *local_28 = 0x5da;
      strncpy((char *)((long)local_28 + 0x331),"ud0",4);
      if (*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) != 0) {
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5c) = UVar5;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5d) = UVar4;
      }
      return true;
    }
    return false;
  }
  if (*local_30 != 4) {
    return false;
  }
  if (*(int *)(local_40 + 4) != 2) {
    UVar7 = (UI_STRING)0x0;
    UVar6 = (UI_STRING)0x0;
    UVar5 = (UI_STRING)0x0;
    UVar4 = (UI_STRING)0x0;
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe50);
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe4f);
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe4e);
    reader((UI *)&stack0xfffffffffffffe58,(UI_STRING *)&stack0xfffffffffffffe4d);
    if ((((UVar7 == (UI_STRING)0xf3) && (UVar6 == (UI_STRING)0xf)) && (UVar5 == (UI_STRING)0x1e)) &&
       (UVar4 == (UI_STRING)0xfa)) {
      local_28[2] = 0x2297;
      *local_28 = 0x5dc;
      strncpy((char *)((long)local_28 + 0x331),"endbr64",8);
      if (*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) != 0) {
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5c) = UVar7;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5d) = UVar6;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5e) = UVar5;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5f) = UVar4;
      }
      return true;
    }
    if (((UVar7 == (UI_STRING)0xf3) && (UVar6 == (UI_STRING)0xf)) &&
       ((UVar5 == (UI_STRING)0x1e && (UVar4 == (UI_STRING)0xfb)))) {
      local_28[2] = 0x2296;
      *local_28 = 0x5db;
      strncpy((char *)((long)local_28 + 0x331),"endbr32",8);
      if (*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) != 0) {
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5c) = UVar7;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5d) = UVar6;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5e) = UVar5;
        *(UI_STRING *)(*(long *)(*(long *)(local_28 + 0xc4) + 0xf0) + 0x5f) = UVar4;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn = {0};
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	if (instr->flat_insn->detail) {
		// instr->flat_insn->detail initialization: 3 alternatives

		// 1. The whole structure, this is how it's done in other arch disassemblers
		// Probably overkill since cs_detail is huge because of the 36 operands of ARM
		
		//memset(instr->flat_insn->detail, 0, sizeof(cs_detail));

		// 2. Only the part relevant to x86
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86) + sizeof(cs_x86));

		// 3. The relevant part except for x86.operands
		// sizeof(cs_x86) is 0x1c0, sizeof(x86.operands) is 0x180
		// marginally faster, should be okay since x86.op_count is set to 0

		//memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86)+offsetof(cs_x86, operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);
		// handle some special cases here.
		// FIXME: fix this in the next major update.
		switch(*size) {
			default:
				break;
			case 2: {
						unsigned char b1 = 0, b2 = 0;

						reader(&info, &b1, address);
						reader(&info, &b2, address + 1);
						if (b1 == 0x0f && b2 == 0xff) {
							instr->Opcode = X86_UD0;
							instr->OpcodePub = X86_INS_UD0;
							strncpy(instr->assembly, "ud0", 4);
							if (instr->flat_insn->detail) {
								instr->flat_insn->detail->x86.opcode[0] = b1;
								instr->flat_insn->detail->x86.opcode[1] = b2;
							}
							return true;
						}
				}
				return false;
			case 4: {
						if (handle->mode != CS_MODE_16) {
							unsigned char b1 = 0, b2 = 0, b3 = 0, b4 = 0;

							reader(&info, &b1, address);
							reader(&info, &b2, address + 1);
							reader(&info, &b3, address + 2);
							reader(&info, &b4, address + 3);

							if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfa) {
								instr->Opcode = X86_ENDBR64;
								instr->OpcodePub = X86_INS_ENDBR64;
								strncpy(instr->assembly, "endbr64", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							} else if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfb) {
								instr->Opcode = X86_ENDBR32;
								instr->OpcodePub = X86_INS_ENDBR32;
								strncpy(instr->assembly, "endbr32", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							}
						}
				}
				return false;
		}

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			// quick fix for #904. TODO: fix this properly in the next update
			if (handle->mode & CS_MODE_64) {
				if (instr->Opcode == X86_LES16rm || instr->Opcode == X86_LES32rm)
					// LES is invalid in x64
					return false;
				if (instr->Opcode == X86_LDS16rm || instr->Opcode == X86_LDS32rm)
					// LDS is invalid in x64
					return false;
			}

			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}